

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

void Fraig_PrintBinary(FILE *pFile,uint *pSign,int nBits)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int i;
  int w;
  int nWords;
  int Remainder;
  int nBits_local;
  uint *pSign_local;
  FILE *pFile_local;
  
  uVar1 = nBits & 0x1f;
  iVar2 = (int)((ulong)(long)nBits >> 5) + (uint)(uVar1 != 0);
  local_28 = iVar2;
  while (local_28 = local_28 + -1, -1 < local_28) {
    if ((local_28 == iVar2 + -1) && (uVar1 != 0)) {
      local_30 = uVar1 - 1;
    }
    else {
      local_30 = 0x1f;
    }
    for (local_2c = local_30; -1 < local_2c; local_2c = local_2c + -1) {
      fprintf((FILE *)pFile,"%c",
              (ulong)(((pSign[local_28] & 1 << ((byte)local_2c & 0x1f)) != 0) + 0x30));
    }
  }
  return;
}

Assistant:

void Fraig_PrintBinary( FILE * pFile, unsigned * pSign, int nBits )
{
    int Remainder, nWords;
    int w, i;

    Remainder = (nBits%(sizeof(unsigned)*8));
    nWords    = (nBits/(sizeof(unsigned)*8)) + (Remainder>0);

    for ( w = nWords-1; w >= 0; w-- )
        for ( i = ((w == nWords-1 && Remainder)? Remainder-1: 31); i >= 0; i-- )
            fprintf( pFile, "%c", '0' + (int)((pSign[w] & (1<<i)) > 0) );

//  fprintf( pFile, "\n" );
}